

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

int get_allocate_points(CHAR_DATA *ch)

{
  int iVar1;
  long in_RDI;
  int i;
  int allocate;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < 5; local_10 = local_10 + 1) {
    local_c = *(short *)((long)*(short *)(in_RDI + 0x136) * 0x88 + 0x921170 + (long)local_10 * 2) +
              -0xd + local_c;
  }
  iVar1 = strcmp(pc_race_table[*(short *)(in_RDI + 0x136)].name,"human");
  if (iVar1 == 0) {
    local_c = local_c + 2;
  }
  return local_c;
}

Assistant:

int get_allocate_points(CHAR_DATA *ch)
{
	int allocate = 0, i;

	for (i = STAT_STR; i < MAX_STATS; i++)
	{
		allocate += (pc_race_table[ch->race].max_stats[i] - 13);
	}

	if (!strcmp(pc_race_table[ch->race].name, "human"))
		allocate += 2;

	return allocate;
}